

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

FX * get_nextFX(FX *fx)

{
  ushort uVar1;
  FX *pFVar2;
  
  if (URaid_scanlink == 0) {
    uVar1 = fx->alink & 0xfffe;
  }
  else {
    uVar1 = *(ushort *)((long)&fx->alink + (ulong)((*(uint *)fx & 1) << 4));
  }
  pFVar2 = (FX *)NativeAligned4FromStackOffset(uVar1 - 10);
  return pFVar2;
}

Assistant:

FX *get_nextFX(FX *fx) {

  if (URaid_scanlink == URSCAN_ALINK)
    return ((FX *)NativeAligned4FromStackOffset(GETALINK(fx)));
  else
    return ((FX *)NativeAligned4FromStackOffset(GETCLINK(fx)));

}